

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Output.cpp
# Opt level: O0

void Output::SkipToColumn(size_t column)

{
  long lVar1;
  size_t sVar2;
  undefined8 *in_FS_OFFSET;
  long local_28;
  size_t dist;
  size_t reference;
  size_t columnbias;
  size_t column_local;
  
  reference = 0;
  if ((*(byte *)*in_FS_OFFSET & 1) != 0) {
    lVar1 = *(long *)*in_FS_OFFSET;
    sVar2 = PAL_wcslen(*(char16_t **)*in_FS_OFFSET);
    reference = lVar1 + sVar2;
  }
  dist = 0;
  if (reference < *(ulong *)*in_FS_OFFSET) {
    dist = *(long *)*in_FS_OFFSET - reference;
  }
  if (dist < column) {
    for (local_28 = column - dist; local_28 != 0; local_28 = local_28 + -1) {
      Print(L" ");
    }
  }
  else {
    Print(L" ");
  }
  return;
}

Assistant:

void
Output::SkipToColumn(size_t column)
{
    size_t columnbias = 0;
    // If we're using a custom alignment and prefix, we want to do this relative to that
    if (usingCustomAlignAndPrefix)
    {
        // If we've already added the alignment and prefix, we need to add the alignment to our column number here
        columnbias = align + wcslen(prefix);
    }
    size_t reference = 0;
    if (Output::s_Column > columnbias)
    {
        reference = Output::s_Column - columnbias;
    }
    if (column <= reference)
    {
        Output::Print(_u(" "));
        return;
    }

    // compute distance to our destination

    size_t dist = column - reference;

    // Print at least one space
    while (dist > 0)
    {
        Output::Print(_u(" "));
        dist--;
    }
}